

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureLogOut_TimeoutWaitingForLogOutResponseHelper::
~initiatorFixtureLogOut_TimeoutWaitingForLogOutResponseHelper
          (initiatorFixtureLogOut_TimeoutWaitingForLogOutResponseHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOut_TimeoutWaitingForLogOutResponse) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);
  object->setLogoutTimeout(-1);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->logout("");
  FIX::Message sendLogout = createLogout( "TW", "ISLD", 2);
  object->send(sendLogout);
  object->next();

  CHECK(!object->sentLogout());
}